

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wdgl.cpp
# Opt level: O0

Stream * rw::wdgl::writeNativeSkin(Stream *stream,int32 len,void *object,int32 offset)

{
  int32 *piVar1;
  Skin *skin;
  int32 offset_local;
  void *object_local;
  int32 len_local;
  Stream *stream_local;
  
  writeChunkHeader(stream,1,len + -0xc);
  Stream::writeU32(stream,2);
  piVar1 = *(int32 **)((long)object + (long)offset);
  Stream::writeI32(stream,*piVar1);
  Stream::write32(stream,*(void **)(piVar1 + 6),*piVar1 << 6);
  return stream;
}

Assistant:

Stream*
writeNativeSkin(Stream *stream, int32 len, void *object, int32 offset)
{
	writeChunkHeader(stream, ID_STRUCT, len-12);
	stream->writeU32(PLATFORM_GL);
	Skin *skin = *PLUGINOFFSET(Skin*, object, offset);
	stream->writeI32(skin->numBones);
	stream->write32(skin->inverseMatrices, skin->numBones*64);
	return stream;
}